

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 *puVar1;
  ParseContext *pPVar2;
  ZeroCopyInputStream *pZVar3;
  ParseContext *pPVar4;
  byte bVar5;
  bool bVar6;
  unsigned_short uVar7;
  uint16_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  int v1;
  int v2;
  char *pcVar11;
  uint *puVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  FieldAux *pFVar14;
  MessageLite *pMVar15;
  TcParseTableBase *this;
  ulong uVar16;
  TailCallParseFunc p_Var17;
  TcParseTableBase *pTVar18;
  LogMessage *pLVar19;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1b0;
  unsigned_short saved_tag;
  uint64_t local_1a8;
  TcParseTableBase *local_1a0;
  ParseContext *local_198;
  ZeroCopyInputStream *local_190;
  MessageLite *local_188;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_180 [2];
  uint local_16c;
  TcParseTableBase *pTStack_168;
  uint32_t has_bits_offset;
  ulong local_160;
  MessageLite *local_158;
  Arena *local_150;
  TcParseTableBase *local_148;
  LimitToken local_13c;
  LogMessage local_138;
  Voidify local_121;
  Nullable<const_char_*> local_120;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  undefined4 local_110;
  int old_depth;
  LimitToken local_fc;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paStack_f8;
  LimitToken old;
  ZeroCopyInputStream *local_e0;
  undefined1 local_c8 [12];
  int size;
  ZeroCopyInputStream *local_b8;
  ParseContext *local_b0;
  ZeroCopyInputStream *local_a8;
  ZeroCopyInputStream *local_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_98;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  ZeroCopyInputStream *local_78;
  MessageLite *local_70;
  ZeroCopyInputStream *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_1a8 = hasbits;
  local_1a0 = table;
  local_198 = ctx;
  local_190 = (ZeroCopyInputStream *)ptr;
  local_188 = msg;
  local_180[0] = data.field_0;
  uVar7 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_180);
  pMVar15 = local_188;
  pZVar3 = local_190;
  pPVar2 = local_198;
  if (uVar7 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe50);
    pcVar11 = MiniParse(pMVar15,(char *)pZVar3,pPVar2,(TcFieldData)aStack_1b0,local_1a0,local_1a8);
    return pcVar11;
  }
  UnalignedLoad<unsigned_short>((char *)local_190);
  local_190 = (ZeroCopyInputStream *)((long)local_190 + 2);
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)local_180);
  local_1a8 = 1L << (bVar5 & 0x3f) | local_1a8;
  local_158 = local_188;
  pTStack_168 = local_1a0;
  local_16c = (uint)local_1a0->has_bits_offset;
  local_160 = local_1a8;
  if (local_16c != 0) {
    uVar9 = (uint)local_1a8;
    puVar12 = RefAt<unsigned_int>(local_188,(ulong)local_16c);
    *puVar12 = uVar9 | *puVar12;
  }
  pMVar15 = local_188;
  uVar8 = TcFieldData::offset((TcFieldData *)local_180);
  aVar13 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar15,(ulong)uVar8);
  pTVar18 = local_1a0;
  bVar5 = TcFieldData::aux_idx((TcFieldData *)local_180);
  pFVar14 = TcParseTableBase::field_aux(pTVar18,(uint)bVar5);
  pTVar18 = pFVar14->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar18;
  if (*(MessageLite **)aVar13 == (MessageLite *)0x0) {
    local_150 = MessageLite::GetArena(local_188);
    local_148 = pTVar18;
    pMVar15 = ClassData::New(pTVar18->class_data,local_150);
    *(MessageLite **)aVar13 = pMVar15;
  }
  pZVar3 = local_190;
  pPVar2 = local_198;
  inner_loop.field = (MessageLite **)&local_198;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  paStack_f8 = &data_local.field_0;
  data_local.field_0 = aVar13;
  EpsCopyInputStream::LimitToken::LimitToken(&local_fc);
  local_b0 = pPVar2;
  local_b8 = pZVar3;
  unique0x10000546 = &local_fc;
  local_c8._4_4_ = ReadSize((char **)&local_b8);
  if ((local_b8 == (ZeroCopyInputStream *)0x0) || (pPVar2->depth_ < 1)) {
    local_a8 = (ZeroCopyInputStream *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_c8,(char *)pPVar2,(int)local_b8);
    EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffff40,(LimitToken *)local_c8);
    EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_c8);
    pPVar2->depth_ = pPVar2->depth_ + -1;
    local_a8 = local_b8;
  }
  if (local_a8 == (ZeroCopyInputStream *)0x0) {
    local_e0 = local_a8;
  }
  else {
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    local_98 = paStack_f8;
    local_a0 = local_a8;
    local_70 = *(MessageLite **)*paStack_f8;
    local_80 = *(ParseContext **)paStack_f8[1];
    local_78 = local_a8;
    local_88 = (TcParseTableBase *)(*(long *)paStack_f8[2] + 0x38);
    while (bVar6 = ParseContext::Done(local_80,(char **)&local_78), pMVar15 = local_70,
          pZVar3 = local_78, pPVar4 = local_80, ((bVar6 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      pTVar18 = local_88;
      this = (TcParseTableBase *)((long)local_88 + -0x38);
      uVar7 = UnalignedLoad<unsigned_short>((char *)pZVar3);
      uVar16 = (ulong)(int)((uint)uVar7 & (uint)*(byte *)((long)pTVar18 + -0x30));
      if ((uVar16 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar16 >> 3)
      ;
      local_58.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar7;
      p_Var17 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (ZeroCopyInputStream *)
                 (*p_Var17)(pMVar15,(char *)pZVar3,pPVar4,(TcFieldData)local_58,this,0);
      if ((local_78 == (ZeroCopyInputStream *)0x0) ||
         (uVar10 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar10 != 1))
      break;
    }
    pTVar18 = (TcParseTableBase *)((long)local_88 + -0x38);
    if ((undefined1  [56])((undefined1  [56])*local_88 & (undefined1  [56])0x100) ==
        (undefined1  [56])0x0) {
      local_88 = pTVar18;
      if (local_78 == (ZeroCopyInputStream *)0x0) {
        VerifyHasBitConsistency(local_70,pTVar18);
      }
      local_68 = local_78;
    }
    else {
      puVar1 = (undefined8 *)((long)local_88 + -0x10);
      local_88 = pTVar18;
      local_68 = (ZeroCopyInputStream *)(*(code *)*puVar1)(local_70,local_78,local_80);
    }
    local_e0 = local_68;
    if (local_68 != (ZeroCopyInputStream *)0x0) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                     (absl_log_internal_check_op_result._4_4_);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_120 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"old_depth == depth_");
      if (local_120 != (Nullable<const_char_*>)0x0) {
        pcVar11 = absl::lts_20250127::implicit_cast<char_const*>(local_120);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x481,pcVar11);
        pLVar19 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_138);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_121,pLVar19);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_138);
      }
      local_120 = (Nullable<const_char_*>)0x0;
    }
    pPVar2->depth_ = pPVar2->depth_ + 1;
    EpsCopyInputStream::LimitToken::LimitToken(&local_13c,&local_fc);
    bVar6 = EpsCopyInputStream::PopLimit(&pPVar2->super_EpsCopyInputStream,&local_13c);
    EpsCopyInputStream::LimitToken::~LimitToken(&local_13c);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
    }
    else {
      local_e0 = (ZeroCopyInputStream *)0x0;
    }
  }
  local_110 = 1;
  EpsCopyInputStream::LimitToken::~LimitToken(&local_fc);
  return (char *)local_e0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}